

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O1

void av1_fwd_txfm2d_32x64_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  int *piVar1;
  undefined8 *puVar2;
  byte bVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  int8_t *piVar10;
  int32_t *piVar11;
  longlong *plVar12;
  undefined4 *puVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  ulong *puVar18;
  undefined4 *puVar19;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 in_XMM2 [16];
  __m128i round;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  __m128i in [512];
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  ulong auStack_2088 [2];
  ulong auStack_2078 [2];
  undefined8 auStack_2068 [2];
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  ulong auStack_2048 [2];
  ulong auStack_2038 [2];
  longlong local_2028 [48];
  undefined4 local_1ea8 [1952];
  
  piVar10 = av1_fwd_txfm_shift_ls[0xb];
  plVar12 = local_2028;
  iVar15 = (int)*av1_fwd_txfm_shift_ls[0xb];
  puVar18 = (ulong *)(input + 0x1c);
  lVar14 = 0x70;
  do {
    *(ulong *)((long)&uStack_2098 + lVar14) = puVar18[-7];
    *(undefined8 *)((long)&uStack_2090 + lVar14) = 0;
    *(ulong *)((long)auStack_2088 + lVar14) = puVar18[-6];
    *(undefined8 *)((long)auStack_2088 + lVar14 + 8) = 0;
    *(ulong *)((long)auStack_2078 + lVar14) = puVar18[-5];
    *(undefined8 *)((long)auStack_2078 + lVar14 + 8) = 0;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = puVar18[-4];
    *(undefined1 (*) [16])((long)auStack_2068 + lVar14) = auVar20;
    auVar20 = pmovsxwd(auVar20,*(undefined8 *)((long)&uStack_2098 + lVar14));
    auVar22 = pmovsxwd(in_XMM2,*(undefined8 *)((long)auStack_2088 + lVar14));
    auVar24 = pmovsxwd(in_XMM3,*(undefined8 *)((long)auStack_2078 + lVar14));
    auVar28 = pmovsxwd(in_XMM4,*(undefined8 *)((long)auStack_2068 + lVar14));
    auVar26._0_4_ = auVar22._0_4_ << iVar15;
    auVar26._4_4_ = auVar22._4_4_;
    auVar26._8_4_ = auVar22._8_4_;
    auVar26._12_4_ = auVar22._12_4_;
    *(int *)((long)&uStack_2098 + lVar14) = auVar20._0_4_ << iVar15;
    *(int *)((long)&uStack_2098 + lVar14 + 4) = auVar20._4_4_;
    *(int *)((long)&uStack_2090 + lVar14) = auVar20._8_4_;
    *(int *)((long)auStack_2088 + lVar14 + -4) = auVar20._12_4_;
    *(undefined1 (*) [16])((long)auStack_2088 + lVar14) = auVar26;
    auVar25._0_4_ = auVar24._0_4_ << iVar15;
    auVar25._4_4_ = auVar24._4_4_;
    auVar25._8_4_ = auVar24._8_4_;
    auVar25._12_4_ = auVar24._12_4_;
    *(undefined1 (*) [16])((long)auStack_2078 + lVar14) = auVar25;
    auVar24._0_4_ = auVar28._0_4_ << iVar15;
    auVar24._4_4_ = auVar28._4_4_;
    auVar24._8_4_ = auVar28._8_4_;
    auVar24._12_4_ = auVar28._12_4_;
    *(undefined1 (*) [16])((long)auStack_2068 + lVar14) = auVar24;
    *(ulong *)((long)&uStack_2058 + lVar14) = puVar18[-3];
    *(undefined8 *)((long)&uStack_2050 + lVar14) = 0;
    *(ulong *)((long)auStack_2048 + lVar14) = puVar18[-2];
    *(undefined8 *)((long)auStack_2048 + lVar14 + 8) = 0;
    *(ulong *)((long)auStack_2038 + lVar14) = puVar18[-1];
    *(undefined8 *)((long)local_2028 + lVar14 + -8) = 0;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = *puVar18;
    *(undefined1 (*) [16])((long)local_2028 + lVar14) = auVar22;
    auVar20 = pmovsxwd(auVar22,*(undefined8 *)((long)&uStack_2058 + lVar14));
    auVar22 = pmovsxwd(auVar26,*(undefined8 *)((long)auStack_2048 + lVar14));
    auVar26 = pmovsxwd(auVar25,*(undefined8 *)((long)auStack_2038 + lVar14));
    auVar24 = pmovsxwd(auVar24,*(undefined8 *)((long)local_2028 + lVar14));
    *(int *)((long)&uStack_2058 + lVar14) = auVar20._0_4_ << iVar15;
    *(int *)((long)&uStack_2058 + lVar14 + 4) = auVar20._4_4_;
    *(int *)((long)&uStack_2050 + lVar14) = auVar20._8_4_;
    *(int *)((long)auStack_2048 + lVar14 + -4) = auVar20._12_4_;
    in_XMM2._0_4_ = auVar22._0_4_ << iVar15;
    in_XMM2._4_4_ = auVar22._4_4_;
    in_XMM2._8_4_ = auVar22._8_4_;
    in_XMM2._12_4_ = auVar22._12_4_;
    in_XMM3._0_4_ = auVar26._0_4_ << iVar15;
    in_XMM3._4_4_ = auVar26._4_4_;
    in_XMM3._8_4_ = auVar26._8_4_;
    in_XMM3._12_4_ = auVar26._12_4_;
    *(undefined1 (*) [16])((long)auStack_2048 + lVar14) = in_XMM2;
    *(undefined1 (*) [16])((long)auStack_2038 + lVar14) = in_XMM3;
    in_XMM4._0_4_ = auVar24._0_4_ << iVar15;
    in_XMM4._4_4_ = auVar24._4_4_;
    in_XMM4._8_4_ = auVar24._8_4_;
    in_XMM4._12_4_ = auVar24._12_4_;
    *(undefined1 (*) [16])((long)local_2028 + lVar14) = in_XMM4;
    lVar14 = lVar14 + 0x80;
    puVar18 = (ulong *)((long)puVar18 + (long)stride * 2);
  } while (lVar14 != 0x2070);
  lVar14 = 0;
  do {
    auStack_2038[1] = 0x42191a;
    av1_fdct64_sse4_1((__m128i *)((long)local_2028 + lVar14),(__m128i *)((long)local_2028 + lVar14),
                      '\r',8,8);
    lVar14 = lVar14 + 0x10;
  } while (lVar14 != 0x80);
  lVar14 = 0;
  do {
    auStack_2038[1] = 0x42193a;
    col_txfm_16x16_rounding((__m128i *)((long)local_2028 + lVar14),-(int)piVar10[1]);
    lVar14 = lVar14 + 0x400;
  } while (lVar14 != 0x2000);
  piVar11 = coeff + 0xc0;
  puVar13 = local_1ea8;
  lVar14 = 0;
  do {
    lVar16 = -0x100;
    puVar19 = puVar13;
    do {
      uVar7 = puVar19[-0x5f];
      uVar4 = puVar19[-0x3f];
      uVar8 = puVar19[-0x20];
      uVar9 = puVar19[-0x1f];
      uVar5 = *puVar19;
      uVar6 = puVar19[1];
      auVar28._0_8_ = CONCAT44(puVar19[-0x3e],puVar19[-0x5e]);
      auVar28._8_4_ = puVar19[-0x5d];
      auVar28._12_4_ = puVar19[-0x3d];
      auVar23._0_8_ = CONCAT44(puVar19[2],puVar19[-0x1e]);
      auVar23._8_4_ = puVar19[-0x1d];
      auVar23._12_4_ = puVar19[3];
      puVar2 = (undefined8 *)((long)piVar11 + lVar16 + -0x200);
      *puVar2 = CONCAT44(puVar19[-0x40],puVar19[-0x60]);
      puVar2[1] = CONCAT44(uVar5,uVar8);
      *(undefined4 *)((long)piVar11 + lVar16 + -0xf8) = uVar7;
      *(undefined4 *)((long)piVar11 + lVar16 + -0xf4) = uVar4;
      *(undefined4 *)((long)piVar11 + lVar16 + -0xf0) = uVar9;
      *(undefined4 *)((long)piVar11 + lVar16 + -0xec) = uVar6;
      auVar21._8_8_ = auVar23._0_8_;
      auVar21._0_8_ = auVar28._0_8_;
      *(undefined1 (*) [16])((long)piVar11 + lVar16) = auVar21;
      puVar2 = (undefined8 *)((long)piVar11 + lVar16 + 0x100);
      *puVar2 = auVar28._8_8_;
      puVar2[1] = auVar23._8_8_;
      puVar19 = puVar19 + 0x80;
      lVar16 = lVar16 + 0x10;
    } while (lVar16 != 0);
    lVar14 = lVar14 + 1;
    piVar11 = piVar11 + 0x100;
    puVar13 = puVar13 + 4;
  } while (lVar14 != 8);
  lVar14 = 0;
  do {
    auStack_2038[1] = 0x421a09;
    av1_fdct32_sse4_1((__m128i *)((long)coeff + lVar14),(__m128i *)((long)local_2028 + lVar14),0xb,
                      0x10);
    lVar14 = lVar14 + 0x10;
  } while (lVar14 != 0x100);
  lVar14 = 0;
  auVar20 = pmovsxwd(extraout_XMM0,0x16a116a116a116a1);
  auVar22 = pmovsxwd(auVar21,0x800080008000800);
  do {
    bVar3 = piVar10[2];
    iVar15 = (int)(char)bVar3;
    if (iVar15 < 0) {
      iVar17 = 1 << (~bVar3 & 0x1f);
      auVar26 = ZEXT416((uint)-iVar15);
      lVar16 = 0;
      do {
        piVar1 = (int *)((long)plVar12 + lVar16);
        auVar29._0_4_ = *piVar1 + iVar17 >> auVar26;
        auVar29._4_4_ = piVar1[1] + iVar17 >> auVar26;
        auVar29._8_4_ = piVar1[2] + iVar17 >> auVar26;
        auVar29._12_4_ = piVar1[3] + iVar17 >> auVar26;
        auVar24 = pmulld(auVar29,auVar20);
        piVar1 = (int *)((long)coeff + lVar16);
        *piVar1 = auVar24._0_4_ + auVar22._0_4_ >> 0xc;
        piVar1[1] = auVar24._4_4_ + auVar22._4_4_ >> 0xc;
        piVar1[2] = auVar24._8_4_ + auVar22._8_4_ >> 0xc;
        piVar1[3] = auVar24._12_4_ + auVar22._12_4_ >> 0xc;
        lVar16 = lVar16 + 0x10;
      } while (lVar16 != 0x80);
    }
    else {
      lVar16 = 0;
      do {
        piVar1 = (int *)((long)plVar12 + lVar16);
        auVar27._0_4_ = *piVar1 << iVar15;
        auVar27._4_4_ = piVar1[1];
        auVar27._8_4_ = piVar1[2];
        auVar27._12_4_ = piVar1[3];
        auVar26 = pmulld(auVar27,auVar20);
        piVar1 = (int *)((long)coeff + lVar16);
        *piVar1 = auVar26._0_4_ + auVar22._0_4_ >> 0xc;
        piVar1[1] = auVar26._4_4_ + auVar22._4_4_ >> 0xc;
        piVar1[2] = auVar26._8_4_ + auVar22._8_4_ >> 0xc;
        piVar1[3] = auVar26._12_4_ + auVar22._12_4_ >> 0xc;
        lVar16 = lVar16 + 0x10;
      } while (lVar16 != 0x80);
    }
    lVar14 = lVar14 + 1;
    coeff = coeff + 0x20;
    plVar12 = (longlong *)((long)plVar12 + 0x100);
  } while (lVar14 != 0x20);
  return;
}

Assistant:

void av1_fwd_txfm2d_32x64_sse4_1(const int16_t *input, int32_t *coeff,
                                 int stride, TX_TYPE tx_type, int bd) {
  (void)tx_type;
  __m128i in[512];
  __m128i *outcoef128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_32X64];
  const int txw_idx = get_txw_idx(TX_32X64);
  const int txh_idx = get_txh_idx(TX_32X64);
  const int txfm_size_col = tx_size_wide[TX_32X64];
  const int txfm_size_row = tx_size_high[TX_32X64];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int num_row = txfm_size_row >> 2;
  const int num_col = txfm_size_col >> 2;

  // column transform
  load_buffer_32x8n(input, in, stride, 0, 0, shift[0], txfm_size_row);
  for (int i = 0; i < num_col; i++) {
    av1_fdct64_sse4_1((in + i), (in + i), bitcol, num_col, num_col);
  }
  for (int i = 0; i < num_col; i++) {
    col_txfm_16x16_rounding((in + i * txfm_size_row), -shift[1]);
  }
  transpose_8nx8n(in, outcoef128, txfm_size_col, txfm_size_row);

  // row transform
  for (int i = 0; i < num_row; i++) {
    av1_fdct32_sse4_1((outcoef128 + i), (in + i), bitrow, num_row);
  }
  for (int i = 0; i < txfm_size_col; i++) {
    av1_round_shift_rect_array_32_sse4_1(in + i * 16, outcoef128 + i * 8, 8,
                                         -shift[2], NewSqrt2);
  }
  (void)bd;
}